

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

int compress2(Bytef *dest,uLongf *destLen,Bytef *source,uLong sourceLen,int level)

{
  ulong *in_RSI;
  undefined8 in_RDI;
  int err;
  z_stream_conflict stream;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff84;
  ulong local_78;
  int in_stack_ffffffffffffff94;
  z_streamp in_stack_ffffffffffffff98;
  int local_4;
  
  if ((*in_RSI & 0xffffffff) == *in_RSI) {
    local_4 = deflateInit_((z_streamp)CONCAT44(in_stack_ffffffffffffff84,(int)*in_RSI),
                           (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff6c);
    if (local_4 == 0) {
      local_4 = deflate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      if (local_4 == 1) {
        *in_RSI = local_78;
        local_4 = deflateEnd((z_streamp)CONCAT44(1,in_stack_ffffffffffffff58));
      }
      else {
        deflateEnd((z_streamp)CONCAT44(local_4,in_stack_ffffffffffffff58));
        if (local_4 == 0) {
          local_4 = -5;
        }
      }
    }
  }
  else {
    local_4 = -5;
  }
  return local_4;
}

Assistant:

int ZEXPORT compress2 (dest, destLen, source, sourceLen, level)
    Bytef *dest;
    uLongf *destLen;
    const Bytef *source;
    uLong sourceLen;
    int level;
{
    z_stream stream;
    int err;

    stream.next_in = (Bytef*)source;
    stream.avail_in = (uInt)sourceLen;
#ifdef MAXSEG_64K
    /* Check for source > 64K on 16-bit machine: */
    if ((uLong)stream.avail_in != sourceLen) return Z_BUF_ERROR;
#endif
    stream.next_out = dest;
    stream.avail_out = (uInt)*destLen;
    if ((uLong)stream.avail_out != *destLen) return Z_BUF_ERROR;

    stream.zalloc = (alloc_func)0;
    stream.zfree = (free_func)0;
    stream.opaque = (voidpf)0;

    err = deflateInit(&stream, level);
    if (err != Z_OK) return err;

    err = deflate(&stream, Z_FINISH);
    if (err != Z_STREAM_END) {
        deflateEnd(&stream);
        return err == Z_OK ? Z_BUF_ERROR : err;
    }
    *destLen = stream.total_out;

    err = deflateEnd(&stream);
    return err;
}